

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O2

FT_Error tt_sbit_decoder_load_image
                   (TT_SBitDecoder decoder,FT_UInt glyph_index,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count,FT_Bool metrics_only)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  FT_Byte *pFVar4;
  ushort *limit;
  FT_Stream stream;
  FT_Bitmap *pFVar5;
  FT_Bool big;
  FT_Error FVar6;
  uint uVar7;
  uint uVar8;
  ushort *puVar9;
  FT_Byte *pFVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  unsigned_short uVar14;
  FT_ULong FVar15;
  long lVar16;
  ulong uVar17;
  undefined7 in_register_00000089;
  ulong uVar18;
  ushort *puVar19;
  uint *puVar20;
  ushort uVar21;
  ulong uVar22;
  FT_ULong FVar23;
  code *local_70;
  FT_Byte *p;
  undefined4 local_5c;
  ulong local_58;
  ulong local_50;
  FT_Int local_48;
  FT_Int local_44;
  uint *local_40;
  FT_Byte *local_38;
  
  if (100 < recurse_count) {
    return 8;
  }
  local_5c = (undefined4)CONCAT71(in_register_00000089,metrics_only);
  FVar23 = decoder->strike_index_array;
  pFVar4 = decoder->eblc_base;
  pFVar10 = pFVar4 + FVar23;
  limit = (ushort *)decoder->eblc_limit;
  FVar15 = 0;
LAB_0020abfb:
  if (decoder->strike_index_count != FVar15) {
    uVar7 = (uint)(ushort)(*(ushort *)(pFVar4 + FVar15 * 8 + FVar23) << 8 |
                          *(ushort *)(pFVar4 + FVar15 * 8 + FVar23) >> 8);
    uVar11 = glyph_index - uVar7;
    if ((glyph_index < uVar7) ||
       ((ushort)(*(ushort *)(pFVar4 + FVar15 * 8 + FVar23 + 2) << 8 |
                *(ushort *)(pFVar4 + FVar15 * 8 + FVar23 + 2) >> 8) < glyph_index))
    goto LAB_0020ac2b;
    lVar12 = (ulong)pFVar10[FVar15 * 8 + 5] * 0x10000;
    uVar13 = (ulong)pFVar10[FVar15 * 8 + 6] * 0x100;
    uVar17 = (ulong)pFVar10[FVar15 * 8 + 7];
    uVar22 = lVar12 + (ulong)pFVar10[FVar15 * 8 + 4] * 0x1000000 | uVar13 | uVar17;
    if ((ulong)((long)limit - (long)pFVar10) < uVar22) {
      return 8;
    }
    puVar19 = (ushort *)(pFVar10 + uVar22 + 8);
    if (limit < puVar19) goto LAB_0020ac74;
    puVar9 = (ushort *)(pFVar10 + uVar22);
    uVar2 = puVar9[1];
    uVar21 = *puVar9 << 8 | *puVar9 >> 8;
    uVar7 = *(uint *)(puVar9 + 2);
    local_48 = x_pos;
    local_44 = y_pos;
    switch(uVar21) {
    case 1:
      if (limit < (ushort *)((long)puVar19 + (ulong)(uVar11 * 4) + 8)) goto LAB_0020ac74;
      puVar20 = (uint *)((long)puVar19 + (ulong)(uVar11 * 4));
      uVar11 = *puVar20;
      uVar8 = puVar20[1];
      uVar13 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                      uVar11 << 0x18);
      uVar17 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                      uVar8 << 0x18);
      break;
    case 2:
      if (puVar9 + 10 <= limit) {
        local_40 = (uint *)(puVar9 + 6);
        local_50 = (ulong)(byte)puVar9[4];
        bVar1 = *(byte *)((long)puVar9 + 9);
        uVar21 = puVar9[5];
        local_58 = (ulong)*(byte *)((long)puVar9 + 0xb);
        FVar6 = tt_sbit_decoder_load_metrics(decoder,(FT_Byte **)&local_40,(FT_Byte *)limit,'\x01');
        if (FVar6 == 0) {
          lVar12 = ((uint)(byte)uVar21 << 8 | (uint)bVar1 << 0x10 | (int)local_50 << 0x18) +
                   local_58;
          uVar13 = (ulong)uVar11 * lVar12;
          uVar17 = lVar12 + uVar13;
          goto LAB_0020af09;
        }
      }
      goto LAB_0020ac74;
    case 3:
      if (limit < (ushort *)((long)puVar19 + (ulong)(uVar11 * 2) + 4)) goto LAB_0020ac74;
      puVar19 = (ushort *)((long)puVar19 + (ulong)(uVar11 * 2));
      uVar21 = *puVar19;
      uVar3 = puVar19[1];
      uVar13 = (ulong)(ushort)(uVar21 << 8 | uVar21 >> 8);
      uVar17 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
      break;
    case 4:
      if (((puVar9 + 6 <= limit) && (puVar9 + 8 <= limit)) &&
         (uVar22 = (ulong)CONCAT11((char)puVar9[5],*(undefined1 *)((long)puVar9 + 0xb)) |
                   (ulong)*(byte *)((long)puVar9 + 9) << 0x10 | (ulong)(byte)puVar9[4] << 0x18,
         uVar22 <= ((long)limit - (long)(puVar9 + 6) >> 2) - 1U)) {
        lVar16 = FVar23 + (ulong)pFVar10[FVar15 * 8 + 4] * 0x1000000;
        uVar18 = 0;
        goto LAB_0020ae21;
      }
      goto LAB_0020ac74;
    case 5:
      goto switchD_0020acd1_caseD_5;
    default:
      if (uVar21 == 0x13) {
switchD_0020acd1_caseD_5:
        if (puVar9 + 0xc <= limit) {
          local_40 = (uint *)(puVar9 + 6);
          uVar21 = puVar9[4];
          bVar1 = *(byte *)((long)puVar9 + 9);
          local_50 = (ulong)(byte)puVar9[5];
          local_58 = (ulong)*(byte *)((long)puVar9 + 0xb);
          FVar6 = tt_sbit_decoder_load_metrics
                            (decoder,(FT_Byte **)&local_40,(FT_Byte *)limit,'\x01');
          if (FVar6 == 0) {
            uVar11 = *local_40;
            uVar13 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                            uVar11 << 0x18);
            if (uVar13 <= (ulong)((long)limit - (long)(local_40 + 1) >> 1)) {
              lVar16 = (ulong)bVar1 * 0x10000 + (ulong)(byte)uVar21 * 0x1000000;
              uVar17 = (ulong)(uint)((int)local_50 << 8);
              lVar12 = 0;
              uVar22 = 0;
              goto LAB_0020ad8f;
            }
          }
        }
      }
      goto LAB_0020ac74;
    }
    if (uVar13 != uVar17) goto LAB_0020aef0;
  }
  goto LAB_0020ac74;
LAB_0020ac2b:
  FVar15 = FVar15 + 1;
  goto LAB_0020abfb;
LAB_0020ad8f:
  if (uVar13 == uVar22) goto LAB_0020ac74;
  uVar21 = *(ushort *)((long)(local_40 + 1) + uVar22 * 2);
  if ((ushort)(uVar21 << 8 | uVar21 >> 8) == glyph_index) {
    uVar17 = (lVar16 + uVar17 + local_58) - lVar12;
    uVar13 = -lVar12;
    goto LAB_0020af09;
  }
  uVar22 = uVar22 + 1;
  lVar12 = lVar12 - (local_58 + uVar17 + lVar16);
  goto LAB_0020ad8f;
LAB_0020ae21:
  if (uVar22 == uVar18) goto LAB_0020ac74;
  if ((ushort)(*(ushort *)(pFVar4 + uVar18 * 4 + lVar12 + uVar13 + lVar16 + uVar17 + 0xc) << 8 |
              *(ushort *)(pFVar4 + uVar18 * 4 + lVar12 + uVar13 + lVar16 + uVar17 + 0xc) >> 8) ==
      glyph_index) {
    lVar12 = lVar16 + lVar12 + uVar13 + uVar17;
    uVar13 = (ulong)(ushort)(*(ushort *)(pFVar4 + uVar18 * 4 + lVar12 + 0xe) << 8 |
                            *(ushort *)(pFVar4 + uVar18 * 4 + lVar12 + 0xe) >> 8);
    uVar17 = (ulong)(ushort)(*(ushort *)(pFVar4 + uVar18 * 4 + lVar12 + 0x12) << 8 |
                            *(ushort *)(pFVar4 + uVar18 * 4 + lVar12 + 0x12) >> 8);
LAB_0020aef0:
    if ((uint)uVar13 <= (uint)uVar17) {
LAB_0020af09:
      FVar23 = uVar17 - uVar13;
      if (FVar23 == 0) {
        return 6;
      }
      uVar22 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18);
      if (decoder->ebdt_size < uVar17 + uVar22) {
        return 6;
      }
      stream = decoder->stream;
      FVar6 = FT_Stream_Seek(stream,uVar13 + uVar22 + decoder->ebdt_start);
      if (FVar6 != 0) {
        return FVar6;
      }
      FVar6 = FT_Stream_ExtractFrame(stream,FVar23,&local_38);
      if (FVar6 != 0) {
        return FVar6;
      }
      p = local_38;
      uVar11 = (ushort)(uVar2 << 8 | uVar2 >> 8) - 1;
      if (0x12 < uVar11) {
switchD_0020afc5_caseD_2:
        FVar6 = 8;
        goto switchD_0020afc5_caseD_12;
      }
      pFVar10 = local_38 + FVar23;
      FVar6 = 7;
      switch(uVar11) {
      case 0:
      case 1:
      case 7:
      case 0x10:
        big = '\0';
        break;
      default:
        goto switchD_0020afc5_caseD_2;
      case 4:
        goto switchD_0020afc5_caseD_4;
      case 5:
      case 6:
      case 8:
      case 0x11:
        big = '\x01';
        break;
      case 0x12:
        goto switchD_0020afc5_caseD_12;
      }
      FVar6 = tt_sbit_decoder_load_metrics(decoder,&p,pFVar10,big);
      if (FVar6 != 0) goto switchD_0020afc5_caseD_12;
      local_70 = tt_sbit_decoder_load_byte_aligned;
      FVar6 = 7;
      pFVar4 = p;
      switch(uVar11) {
      case 0:
      case 5:
        break;
      case 1:
      case 6:
        uVar8 = (uint)decoder->metrics->height;
        uVar11 = (uint)decoder->metrics->width;
        uVar7 = (uVar11 + 7 >> 3) * uVar8;
        if ((uVar7 <= uVar8 * uVar11 + 7 >> 3) || (uVar7 != (int)pFVar10 - (int)p))
        goto LAB_0020b045;
        break;
      default:
        goto switchD_0020afc5_caseD_2;
      case 4:
switchD_0020afc5_caseD_4:
LAB_0020b045:
        local_70 = tt_sbit_decoder_load_bit_aligned;
        break;
      case 7:
        pFVar4 = p + 1;
        if (p + 1 <= pFVar10) goto switchD_0020b00e_caseD_8;
        goto LAB_0020b085;
      case 8:
switchD_0020b00e_caseD_8:
        p = pFVar4;
        local_70 = tt_sbit_decoder_load_compound;
        break;
      case 0x10:
      case 0x11:
        goto switchD_0020afc5_caseD_12;
      }
      if (decoder->bitmap_allocated == '\0') {
        if (decoder->metrics_loaded == '\0') {
          FVar6 = 6;
          goto switchD_0020afc5_caseD_12;
        }
        pFVar5 = decoder->bitmap;
        uVar2 = decoder->metrics->width;
        uVar11 = (uint)uVar2;
        uVar21 = decoder->metrics->height;
        pFVar5->width = (uint)uVar2;
        pFVar5->rows = (uint)uVar21;
        bVar1 = decoder->bit_depth;
        FVar6 = 3;
        if (bVar1 - 1 < 8) {
          uVar7 = (uint)uVar2;
          switch((uint)bVar1) {
          case 1:
            pFVar5->pixel_mode = '\x01';
            uVar11 = uVar7 + 7 >> 3;
            uVar14 = 2;
            break;
          case 2:
            pFVar5->pixel_mode = '\x03';
            uVar11 = uVar7 + 3 >> 2;
            uVar14 = 4;
            break;
          default:
            goto switchD_0020afc5_caseD_12;
          case 4:
            pFVar5->pixel_mode = '\x04';
            uVar11 = uVar7 + 1 >> 1;
            uVar14 = 0x10;
            break;
          case 8:
            pFVar5->pixel_mode = '\x02';
            goto LAB_0020b10c;
          }
        }
        else {
          if (bVar1 != 0x20) goto switchD_0020afc5_caseD_12;
          pFVar5->pixel_mode = '\a';
          uVar11 = (uint)uVar2 << 2;
LAB_0020b10c:
          uVar14 = 0x100;
        }
        pFVar5->pitch = uVar11;
        pFVar5->num_grays = uVar14;
        if (((char)local_5c != '\0') || (FVar23 = (ulong)uVar11 * (ulong)uVar21, FVar23 == 0))
        goto LAB_0020b07a;
        FVar6 = ft_glyphslot_alloc_bitmap((decoder->face->root).glyph,FVar23);
        if (FVar6 != 0) goto switchD_0020afc5_caseD_12;
        decoder->bitmap_allocated = '\x01';
      }
      else {
LAB_0020b07a:
        if ((char)local_5c != '\0') {
LAB_0020b085:
          FVar6 = 0;
          goto switchD_0020afc5_caseD_12;
        }
      }
      FVar6 = (*local_70)(decoder,p,pFVar10,local_48,local_44,recurse_count);
switchD_0020afc5_caseD_12:
      FT_Stream_ReleaseFrame(stream,&local_38);
      return FVar6;
    }
LAB_0020ac74:
    if (recurse_count != 0) {
      return 0x15;
    }
    return 0x9d;
  }
  uVar18 = uVar18 + 1;
  goto LAB_0020ae21;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_image( TT_SBitDecoder  decoder,
                              FT_UInt         glyph_index,
                              FT_Int          x_pos,
                              FT_Int          y_pos,
                              FT_UInt         recurse_count,
                              FT_Bool         metrics_only )
  {
    FT_Byte*  p          = decoder->eblc_base + decoder->strike_index_array;
    FT_Byte*  p_limit    = decoder->eblc_limit;
    FT_ULong  num_ranges = decoder->strike_index_count;
    FT_UInt   start, end, index_format, image_format;
    FT_ULong  image_start = 0, image_end = 0, image_offset;


    /* arbitrary recursion limit */
    if ( recurse_count > 100 )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " recursion depth exceeded\n" ));
      goto Failure;
    }


    /* First, we find the correct strike range that applies to this */
    /* glyph index.                                                 */
    for ( ; num_ranges > 0; num_ranges-- )
    {
      start = FT_NEXT_USHORT( p );
      end   = FT_NEXT_USHORT( p );

      if ( glyph_index >= start && glyph_index <= end )
        goto FoundRange;

      p += 4;  /* ignore index offset */
    }
    goto NoBitmap;

  FoundRange:
    image_offset = FT_NEXT_ULONG( p );

    /* overflow check */
    p = decoder->eblc_base + decoder->strike_index_array;
    if ( image_offset > (FT_ULong)( p_limit - p ) )
      goto Failure;

    p += image_offset;
    if ( p + 8 > p_limit )
      goto NoBitmap;

    /* now find the glyph's location and extend within the ebdt table */
    index_format = FT_NEXT_USHORT( p );
    image_format = FT_NEXT_USHORT( p );
    image_offset = FT_NEXT_ULONG ( p );

    switch ( index_format )
    {
    case 1: /* 4-byte offsets relative to `image_offset' */
      p += 4 * ( glyph_index - start );
      if ( p + 8 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_ULONG( p );
      image_end   = FT_NEXT_ULONG( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 2: /* big metrics, constant image size */
      {
        FT_ULong  image_size;


        if ( p + 12 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        image_start = image_size * ( glyph_index - start );
        image_end   = image_start + image_size;
      }
      break;

    case 3: /* 2-byte offsets relative to 'image_offset' */
      p += 2 * ( glyph_index - start );
      if ( p + 4 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_USHORT( p );
      image_end   = FT_NEXT_USHORT( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 4: /* sparse glyph array with (glyph,offset) pairs */
      {
        FT_ULong  mm, num_glyphs;


        if ( p + 4 > p_limit )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + ( num_glyphs + 1 ) * 4 */
        if ( p + 4 > p_limit                                         ||
             num_glyphs > (FT_ULong)( ( ( p_limit - p ) >> 2 ) - 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
          {
            image_start = FT_NEXT_USHORT( p );
            p          += 2;
            image_end   = FT_PEEK_USHORT( p );
            break;
          }
          p += 2;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;
      }
      break;

    case 5: /* constant metrics with sparse glyph codes */
    case 19:
      {
        FT_ULong  image_size, mm, num_glyphs;


        if ( p + 16 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + 2 * num_glyphs */
        if ( num_glyphs > (FT_ULong)( ( p_limit - p ) >> 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
            break;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;

        image_start = image_size * mm;
        image_end   = image_start + image_size;
      }
      break;

    default:
      goto NoBitmap;
    }

    if ( image_start > image_end )
      goto NoBitmap;

    image_end  -= image_start;
    image_start = image_offset + image_start;

    FT_TRACE3(( "tt_sbit_decoder_load_image:"
                " found sbit (format %d) for glyph index %d\n",
                image_format, glyph_index ));

    return tt_sbit_decoder_load_bitmap( decoder,
                                        image_format,
                                        image_start,
                                        image_end,
                                        x_pos,
                                        y_pos,
                                        recurse_count,
                                        metrics_only );

  Failure:
    return FT_THROW( Invalid_Table );

  NoBitmap:
    if ( recurse_count )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " missing subglyph sbit with glyph index %d\n",
                  glyph_index ));
      return FT_THROW( Invalid_Composite );
    }

    FT_TRACE4(( "tt_sbit_decoder_load_image:"
                " no sbit found for glyph index %d\n", glyph_index ));
    return FT_THROW( Missing_Bitmap );
  }